

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O3

void usage(options_description *options)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"usage: multi_serial_dump [options]",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  plVar1 = (long *)boost::program_options::operator<<((ostream *)&std::cout,options);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"interface-defintion:\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "  <name>[:(<baudrate>,<bits><parity><stop-bits>|<baudrare>|<bits><parity><stop-bits>]\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  <name> : <device-name>[(<alias>)]\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nexamples:\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  multi_serial_dump --interface com1:14404,8n1\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  multi_serial_dump -I /dev/cu.1233(com2):14404,7o1.5\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  multi_serial_dump -I com1 -I com2\n",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void usage( const po::options_description& options )
{
    std::cout << "usage: multi_serial_dump [options]" << std::endl;
    std::cout << options << std::endl;

    std::cout << "interface-defintion:\n";
    std::cout << "  <name>[:(<baudrate>,<bits><parity><stop-bits>|<baudrare>|<bits><parity><stop-bits>]\n";
    std::cout << "  <name> : <device-name>[(<alias>)]\n";

    std::cout << "\nexamples:\n";
    std::cout << "  multi_serial_dump --interface com1:14404,8n1\n";
    std::cout << "  multi_serial_dump -I /dev/cu.1233(com2):14404,7o1.5\n";
    std::cout << "  multi_serial_dump -I com1 -I com2\n";

    std::cout << std::endl;
}